

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O2

void __thiscall SQVM::Raise_Error(SQVM *this,SQObjectPtr *desc)

{
  SQObjectPtr::operator=(&this->_lasterror,desc);
  return;
}

Assistant:

void SQVM::Raise_Error(const SQObjectPtr &desc)
{
    _lasterror = desc;
}